

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
::string_matcher(string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
                 *this,string_type *str,
                regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  std::__cxx11::string::string((string *)this,(string *)str);
  this->end_ = (this->str_)._M_dataplus._M_p + (this->str_)._M_string_length;
  return;
}

Assistant:

string_matcher(string_type const &str, Traits const &tr)
          : str_(str)
          , end_()
        {
            typename range_iterator<string_type>::type cur = boost::begin(this->str_);
            typename range_iterator<string_type>::type end = boost::end(this->str_);
            for(; cur != end; ++cur)
            {
                *cur = detail::translate(*cur, tr, icase_type());
            }
            this->end_ = detail::data_end(str_);
        }